

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O0

void __thiscall
MyServerConnection::OnData(MyServerConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  LogStringBuffer *buffer_12;
  uint in_ECX;
  byte *in_RDX;
  uint in_ESI;
  element_type *in_RDI;
  bool validated;
  shared_ptr<MyServerConnection> *connection_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  *__range2_1;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections_1;
  uint8_t msg [1400];
  char *str;
  TonkStatus status;
  SDKResult result;
  TonkStatus statusAlice;
  shared_ptr<MyServerConnection> *connection;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  *__range2;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  TonkStatus statusBob;
  uint64_t owdUsec;
  uint64_t nowUsec;
  uint i_1;
  uint32_t packetIndex_1;
  uint32_t magic_1;
  uint64_t lo23;
  uint64_t lo16;
  uint32_t ts23;
  uint16_t ts16;
  uint i;
  uint32_t packetIndex;
  uint32_t magic;
  LogStringBuffer buffer_3;
  LogStringBuffer buffer;
  LogStringBuffer buffer_9;
  LogStringBuffer buffer_10;
  LogStringBuffer buffer_4;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_5;
  LogStringBuffer buffer_6;
  LogStringBuffer buffer_7;
  LogStringBuffer buffer_8;
  LogStringBuffer buffer_11;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  *in_stack_ffffffffffffd298;
  LogStringBuffer *in_stack_ffffffffffffd2a0;
  SDKConnection *in_stack_ffffffffffffd2a8;
  OWDTimeStatistics *in_stack_ffffffffffffd2b0;
  SDKResult *in_stack_ffffffffffffd2c8;
  LogStringBuffer *in_stack_ffffffffffffd2d8;
  OutputWorker *in_stack_ffffffffffffd2e0;
  Channel *pCVar4;
  OutputWorker *this_00;
  SDKConnectionList<MyServerConnection> *in_stack_ffffffffffffd2e8;
  undefined1 *puVar5;
  uint local_2acc;
  undefined1 local_2ac5;
  TonkResult local_2ac4;
  __shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2> *local_2ac0;
  shared_ptr<MyServerConnection> *local_2ab8;
  __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
  local_2ab0;
  undefined1 *local_2aa8;
  OWDTimeStatistics *in_stack_ffffffffffffd560;
  uint8_t auStack_2a87 [3];
  undefined1 auStack_2a84 [1404];
  byte *local_2508;
  uint32_t local_24fc [5];
  string local_24e8 [32];
  TonkResult local_24c8;
  uint local_24b4 [5];
  __shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2> *local_24a0;
  shared_ptr<MyServerConnection> *local_2498;
  __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
  local_2490;
  undefined1 *local_2488;
  undefined1 local_2480 [28];
  uint local_2464 [5];
  int local_2450;
  int local_244c;
  long local_2448;
  uint64_t local_2440;
  uint local_2434;
  uint local_241c;
  uint32_t local_2418;
  uint32_t local_2414;
  uint64_t local_2410;
  uint64_t local_2408;
  uint32_t local_2400;
  uint16_t local_23fa;
  uint local_23f8;
  uint32_t local_23f4;
  uint32_t local_23f0;
  uint local_23ec;
  byte *local_23e8;
  uint local_23dc;
  char *local_23d0;
  Channel *local_23c8;
  char *local_23c0;
  Channel *local_23b8;
  char *local_23b0;
  Channel *local_23a8;
  char *local_23a0;
  Channel *local_2398;
  char *local_2390;
  Channel *local_2388;
  char *local_2380;
  Channel *local_2378;
  uint *local_2370;
  char *local_2368;
  int *local_2360;
  char *local_2358;
  int *local_2350;
  char *local_2348;
  Channel *local_2340;
  char *local_2338;
  uint *local_2330;
  char *local_2328;
  uint *local_2320;
  char *local_2318;
  Channel *local_2310;
  string *local_2308;
  char *local_2300;
  Channel *local_22f8;
  char *local_22f0;
  byte **local_22e8;
  char *local_22e0;
  uint *local_22d8;
  char *local_22d0;
  Channel *local_22c8;
  char *local_22c0;
  Channel *local_22b8;
  uint *local_22b0;
  char *local_22a8;
  uint *local_22a0;
  char *local_2298;
  Channel *local_2290;
  char *local_2288;
  undefined4 local_227c;
  Channel *local_2278;
  undefined4 local_226c;
  Channel *local_2268;
  char *local_2260;
  undefined4 local_2254;
  Channel *local_2250;
  undefined4 local_2244;
  Channel *local_2240;
  char *local_2238;
  undefined4 local_222c;
  Channel *local_2228;
  undefined4 local_221c;
  Channel *local_2218;
  undefined1 local_2200 [16];
  ostream aoStack_21f0 [376];
  char *local_2078;
  undefined4 local_206c;
  Channel *local_2068;
  undefined1 local_2050 [16];
  ostream aoStack_2040 [376];
  char *local_1ec8;
  undefined4 local_1ebc;
  Channel *local_1eb8;
  undefined1 local_1ea0 [16];
  ostream aoStack_1e90 [376];
  char *local_1d18;
  undefined4 local_1d0c;
  Channel *local_1d08;
  char *local_1d00;
  undefined8 local_1cf8;
  undefined1 *local_1cf0;
  Channel *local_1ce8;
  undefined8 local_1ce0;
  undefined1 *local_1cd8;
  Channel *local_1cd0;
  undefined8 local_1cc8;
  undefined1 *local_1cc0;
  char *local_1cb8;
  undefined8 local_1cb0;
  undefined1 *local_1ca8;
  Channel *local_1ca0;
  undefined8 local_1c98;
  undefined1 *local_1c90;
  Channel *local_1c88;
  undefined8 local_1c80;
  undefined1 *local_1c78;
  char *local_1c70;
  undefined8 local_1c68;
  undefined1 *local_1c60;
  Channel *local_1c58;
  undefined8 local_1c50;
  undefined1 *local_1c48;
  Channel *local_1c40;
  undefined8 local_1c38;
  undefined1 *local_1c30;
  char *local_1c28;
  undefined1 *local_1c20;
  Channel *local_1c18;
  char *local_1c10;
  undefined1 *local_1c08;
  Channel *local_1c00;
  char *local_1bf8;
  undefined1 *local_1bf0;
  Channel *local_1be8;
  char *local_1be0;
  undefined1 *local_1bd8;
  char *local_1bd0;
  undefined1 *local_1bc8;
  char *local_1bc0;
  undefined1 *local_1bb8;
  char *local_1bb0;
  undefined4 local_1ba4;
  Channel *local_1ba0;
  undefined4 local_1b94;
  Channel *local_1b90;
  char *local_1b88;
  undefined4 local_1b7c;
  Channel *local_1b78;
  undefined4 local_1b6c;
  Channel *local_1b68;
  char *local_1b60;
  undefined4 local_1b54;
  Channel *local_1b50;
  undefined4 local_1b44;
  Channel *local_1b40;
  undefined1 local_1b28 [392];
  char *local_19a0;
  undefined4 local_1994;
  Channel *local_1990;
  undefined1 local_1978 [16];
  ostream aoStack_1968 [376];
  char *local_17f0;
  undefined4 local_17e4;
  Channel *local_17e0;
  undefined1 local_17c8 [16];
  ostream aoStack_17b8 [376];
  char *local_1640;
  undefined4 local_1634;
  Channel *local_1630;
  char *local_1628;
  undefined8 local_1620;
  undefined1 *local_1618;
  Channel *local_1610;
  undefined8 local_1608;
  undefined1 *local_1600;
  Channel *local_15f8;
  undefined8 local_15f0;
  undefined1 *local_15e8;
  char *local_15e0;
  undefined8 local_15d8;
  undefined1 *local_15d0;
  Channel *local_15c8;
  undefined8 local_15c0;
  undefined1 *local_15b8;
  Channel *local_15b0;
  undefined8 local_15a8;
  undefined1 *local_15a0;
  char *local_1598;
  string *local_1590;
  undefined1 *local_1588;
  OutputWorker *local_1580;
  string *local_1578;
  undefined1 *local_1570;
  OutputWorker *local_1568;
  string *local_1560;
  undefined1 *local_1558;
  char *local_1550;
  undefined1 *local_1548;
  OutputWorker *local_1540;
  char *local_1538;
  undefined1 *local_1530;
  Channel *local_1528;
  char *local_1520;
  undefined1 *local_1518;
  Channel *local_1510;
  char *local_1508;
  undefined1 *local_1500;
  char *local_14f8;
  undefined1 *local_14f0;
  char *local_14e8;
  undefined1 *local_14e0;
  char *local_14d8;
  undefined4 local_14cc;
  Channel *local_14c8;
  undefined4 local_14bc;
  Channel *local_14b8;
  undefined1 local_14a0 [16];
  ostream aoStack_1490 [376];
  char *local_1318;
  undefined4 local_130c;
  Channel *local_1308;
  char *local_1300;
  undefined8 local_12f8;
  undefined1 *local_12f0;
  Channel *local_12e8;
  undefined8 local_12e0;
  undefined1 *local_12d8;
  Channel *local_12d0;
  undefined8 local_12c8;
  undefined1 *local_12c0;
  char *local_12b8;
  undefined1 *local_12b0;
  Channel *local_12a8;
  char *local_12a0;
  undefined1 *local_1298;
  uint *local_1290;
  char *local_1288;
  int *local_1280;
  char *local_1278;
  int *local_1270;
  char *local_1268;
  undefined4 local_125c;
  Channel *local_1258;
  undefined4 local_124c;
  Channel *local_1248;
  undefined1 local_1230 [16];
  ostream aoStack_1220 [376];
  uint *local_10a8;
  char *local_10a0;
  int *local_1098;
  char *local_1090;
  int *local_1088;
  char *local_1080;
  undefined4 local_1074;
  Channel *local_1070;
  uint *local_1068;
  char *local_1060;
  int *local_1058;
  char *local_1050;
  int *local_1048;
  char *local_1040;
  undefined8 local_1038;
  undefined1 *local_1030;
  Channel *local_1028;
  undefined8 local_1020;
  undefined1 *local_1018;
  Channel *local_1010;
  undefined8 local_1008;
  undefined1 *local_1000;
  uint *local_ff8;
  char *local_ff0;
  int *local_fe8;
  char *local_fe0;
  int *local_fd8;
  char *local_fd0;
  undefined1 *local_fc8;
  Channel *local_fc0;
  char *local_fb8;
  undefined1 *local_fb0;
  Channel *local_fa8;
  uint *local_fa0;
  char *local_f98;
  int *local_f90;
  char *local_f88;
  int *local_f80;
  undefined1 *local_f78;
  Channel *local_f70;
  char *local_f68;
  undefined1 *local_f60;
  int *local_f58;
  undefined1 *local_f50;
  Channel *local_f48;
  uint *local_f40;
  char *local_f38;
  int *local_f30;
  char *local_f28;
  undefined1 *local_f20;
  Channel *local_f18;
  int *local_f10;
  undefined1 *local_f08;
  char *local_f00;
  undefined1 *local_ef8;
  Channel *local_ef0;
  uint *local_ee8;
  char *local_ee0;
  int *local_ed8;
  undefined1 *local_ed0;
  Channel *local_ec8;
  int *local_ec0;
  undefined1 *local_eb8;
  Channel *local_eb0;
  int *local_ea8;
  undefined1 *local_ea0;
  char *local_e98;
  undefined1 *local_e90;
  uint *local_e88;
  char *local_e80;
  undefined1 *local_e78;
  Channel *local_e70;
  uint *local_e68;
  undefined1 *local_e60;
  Channel *local_e58;
  uint *local_e50;
  undefined1 *local_e48;
  char *local_e40;
  undefined1 *local_e38;
  Channel *local_e30;
  char *local_e28;
  undefined1 *local_e20;
  char *local_e18;
  uint *local_e10;
  char *local_e08;
  uint *local_e00;
  char *local_df8;
  undefined4 local_dec;
  Channel *local_de8;
  undefined4 local_ddc;
  Channel *local_dd8;
  undefined1 local_dc0 [16];
  ostream aoStack_db0 [376];
  char *local_c38;
  uint *local_c30;
  char *local_c28;
  uint *local_c20;
  char *local_c18;
  undefined4 local_c0c;
  Channel *local_c08;
  char *local_c00;
  uint *local_bf8;
  char *local_bf0;
  uint *local_be8;
  char *local_be0;
  undefined8 local_bd8;
  undefined1 *local_bd0;
  Channel *local_bc8;
  undefined8 local_bc0;
  undefined1 *local_bb8;
  Channel *local_bb0;
  undefined8 local_ba8;
  undefined1 *local_ba0;
  char *local_b98;
  uint *local_b90;
  char *local_b88;
  uint *local_b80;
  char *local_b78;
  undefined1 *local_b70;
  Channel *local_b68;
  char *local_b60;
  undefined1 *local_b58;
  Channel *local_b50;
  char *local_b48;
  uint *local_b40;
  char *local_b38;
  uint *local_b30;
  undefined1 *local_b28;
  Channel *local_b20;
  uint *local_b18;
  undefined1 *local_b10;
  Channel *local_b08;
  uint *local_b00;
  undefined1 *local_af8;
  char *local_af0;
  undefined1 *local_ae8;
  char *local_ae0;
  uint *local_ad8;
  char *local_ad0;
  undefined1 *local_ac8;
  Channel *local_ac0;
  char *local_ab8;
  undefined1 *local_ab0;
  Channel *local_aa8;
  char *local_aa0;
  uint *local_a98;
  undefined1 *local_a90;
  Channel *local_a88;
  uint *local_a80;
  undefined1 *local_a78;
  Channel *local_a70;
  uint *local_a68;
  undefined1 *local_a60;
  char *local_a58;
  undefined1 *local_a50;
  char *local_a48;
  undefined1 *local_a40;
  Channel *local_a38;
  char *local_a30;
  undefined1 *local_a28;
  string *local_a20;
  char *local_a18;
  undefined4 local_a0c;
  Channel *local_a08;
  undefined4 local_9fc;
  Channel *local_9f8;
  undefined1 local_9e0 [16];
  ostream aoStack_9d0 [376];
  string *local_858;
  char *local_850;
  undefined4 local_844;
  Channel *local_840;
  string *local_838;
  char *local_830;
  undefined8 local_828;
  undefined1 *local_820;
  Channel *local_818;
  undefined8 local_810;
  undefined1 *local_808;
  Channel *local_800;
  undefined8 local_7f8;
  undefined1 *local_7f0;
  string *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  Channel *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  Channel *local_7b8;
  string *local_7b0;
  undefined1 *local_7a8;
  Channel *local_7a0;
  string *local_798;
  undefined1 *local_790;
  char *local_788;
  undefined1 *local_780;
  char *local_778;
  byte **local_770;
  char *local_768;
  uint *local_760;
  char *local_758;
  undefined4 local_74c;
  Channel *local_748;
  undefined4 local_73c;
  Channel *local_738;
  undefined1 local_720 [16];
  ostream aoStack_710 [376];
  char *local_598;
  byte **local_590;
  char *local_588;
  uint *local_580;
  char *local_578;
  undefined4 local_56c;
  Channel *local_568;
  char *local_560;
  byte **local_558;
  char *local_550;
  uint *local_548;
  char *local_540;
  undefined8 local_538;
  undefined1 *local_530;
  Channel *local_528;
  undefined8 local_520;
  undefined1 *local_518;
  Channel *local_510;
  undefined8 local_508;
  undefined1 *local_500;
  char *local_4f8;
  byte **local_4f0;
  char *local_4e8;
  uint *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  Channel *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  Channel *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  byte **local_490;
  char *local_488;
  uint *local_480;
  undefined1 *local_478;
  Channel *local_470;
  uint *local_468;
  undefined1 *local_460;
  Channel *local_458;
  uint *local_450;
  undefined1 *local_448;
  char *local_440;
  byte **local_438;
  char *local_430;
  undefined1 *local_428;
  Channel *local_420;
  char *local_418;
  undefined1 *local_410;
  Channel *local_408;
  char *local_400;
  byte **local_3f8;
  undefined1 *local_3f0;
  Channel *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  Channel *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  byte **local_3a8;
  undefined1 *local_3a0;
  Channel *local_398;
  byte **local_390;
  undefined1 *local_388;
  uint *local_380;
  char *local_378;
  uint *local_370;
  char *local_368;
  undefined4 local_35c;
  Channel *local_358;
  undefined4 local_34c;
  Channel *local_348;
  undefined1 local_330 [16];
  ostream aoStack_320 [376];
  uint *local_1a8;
  char *local_1a0;
  uint *local_198;
  char *local_190;
  undefined4 local_184;
  Channel *local_180;
  uint *local_178;
  char *local_170;
  uint *local_168;
  char *local_160;
  undefined8 local_158;
  undefined1 *local_150;
  Channel *local_148;
  undefined8 local_140;
  undefined1 *local_138;
  Channel *local_130;
  undefined8 local_128;
  undefined1 *local_120;
  uint *local_118;
  char *local_110;
  uint *local_108;
  char *local_100;
  undefined1 *local_f8;
  Channel *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  Channel *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  uint *local_c0;
  char *local_b8;
  uint *local_b0;
  undefined1 *local_a8;
  Channel *local_a0;
  uint *local_98;
  undefined1 *local_90;
  Channel *local_88;
  uint *local_80;
  undefined1 *local_78;
  uint *local_70;
  char *local_68;
  undefined1 *local_60;
  Channel *local_58;
  uint *local_50;
  undefined1 *local_48;
  Channel *local_40;
  uint *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  if (in_ECX != 0) {
    if (*in_RDX == 200) {
      OnData::expected = OnData::expected + 1;
      if (in_RDX[1] != OnData::expected) {
        OnData::expected = in_RDX[1];
      }
    }
    else {
      local_23ec = in_ECX;
      local_23e8 = in_RDX;
      if (*in_RDX == 7) {
        local_23f0 = tonk::ReadU24_LE(in_RDX + 6);
        if (local_23f0 != 0xadd12d) {
          local_23b8 = &Logger;
          local_23c0 = "Corrupted data: Bad magic";
          local_2250 = &Logger;
          local_2254 = 4;
          local_2260 = "Corrupted data: Bad magic";
          local_2240 = &Logger;
          local_2244 = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_1eb8 = &Logger;
            local_1ebc = 4;
            local_1ec8 = "Corrupted data: Bad magic";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
            local_1cb0 = 0x129358;
            local_1ca0 = &Logger;
            local_1cb8 = local_1ec8;
            local_1c88 = &Logger;
            local_1ca8 = local_2050;
            local_1c98 = local_1cb0;
            local_1c90 = local_2050;
            local_1c80 = local_1cb0;
            local_1c78 = local_2050;
            std::operator<<(aoStack_2040,(string *)&Logger.Prefix);
            local_1c00 = &Logger;
            local_1c08 = local_1ca8;
            local_1c10 = local_1cb8;
            local_1bc8 = local_1ca8;
            local_1bd0 = local_1cb8;
            std::operator<<((ostream *)(local_1ca8 + 0x10),local_1cb8);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10470e);
          }
        }
        local_23f4 = tonk::ReadU32_LE(local_23e8 + 9);
        if (in_RDI->NextPacketIndex != local_23f4) {
          local_2388 = &Logger;
          local_2390 = "Corrupted data: Incorrect packet id";
          local_1ba0 = &Logger;
          local_1ba4 = 4;
          local_1bb0 = "Corrupted data: Incorrect packet id";
          local_1b90 = &Logger;
          local_1b94 = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_1630 = &Logger;
            local_1634 = 4;
            local_1640 = "Corrupted data: Incorrect packet id";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
            local_1620 = 0x129358;
            local_1610 = &Logger;
            local_1628 = local_1640;
            local_15f8 = &Logger;
            local_1618 = local_17c8;
            local_1608 = local_1620;
            local_1600 = local_17c8;
            local_15f0 = local_1620;
            local_15e8 = local_17c8;
            std::operator<<(aoStack_17b8,(string *)&Logger.Prefix);
            local_1510 = &Logger;
            local_1518 = local_1618;
            local_1520 = local_1628;
            local_1500 = local_1618;
            local_1508 = local_1628;
            std::operator<<((ostream *)(local_1618 + 0x10),local_1628);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1049c5);
          }
        }
        in_RDI->NextPacketIndex = local_23f4 + 1;
        for (local_23f8 = 0xd; local_23f8 < local_23ec; local_23f8 = local_23f8 + 1) {
        }
      }
      else if (*in_RDX == 8) {
        if (in_ESI != 0x98) {
          local_2378 = &Logger;
          local_2380 = "Corrupted data: Wrong channel";
          local_14c8 = &Logger;
          local_14cc = 4;
          local_14d8 = "Corrupted data: Wrong channel";
          local_14b8 = &Logger;
          local_14bc = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_1308 = &Logger;
            local_130c = 4;
            local_1318 = "Corrupted data: Wrong channel";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
            local_12f8 = 0x129358;
            local_12e8 = &Logger;
            local_1300 = local_1318;
            local_12d0 = &Logger;
            local_12f0 = local_14a0;
            local_12e0 = local_12f8;
            local_12d8 = local_14a0;
            local_12c8 = local_12f8;
            local_12c0 = local_14a0;
            std::operator<<(aoStack_1490,(string *)&Logger.Prefix);
            local_12a8 = &Logger;
            local_12b0 = local_12f0;
            local_12b8 = local_1300;
            local_1298 = local_12f0;
            local_12a0 = local_1300;
            std::operator<<((ostream *)(local_12f0 + 0x10),local_1300);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x104cb1);
          }
        }
        local_23fa = tonk::ReadU16_LE(local_23e8 + 1);
        local_2400 = tonk::ReadU24_LE(local_23e8 + 3);
        local_2408 = tonk::SDKConnection::FromLocalTime16
                               ((SDKConnection *)in_stack_ffffffffffffd2a0,
                                (uint16_t)((ulong)in_stack_ffffffffffffd298 >> 0x30));
        local_2410 = tonk::SDKConnection::FromLocalTime23
                               ((SDKConnection *)in_stack_ffffffffffffd2a0,
                                (uint32_t)((ulong)in_stack_ffffffffffffd298 >> 0x20));
        local_2414 = tonk::ReadU24_LE(local_23e8 + 6);
        if (local_2414 != 0xadd12d) {
          local_23c8 = &Logger;
          local_23d0 = "Corrupted data: Bad magic";
          local_2228 = &Logger;
          local_222c = 4;
          local_2238 = "Corrupted data: Bad magic";
          local_2218 = &Logger;
          local_221c = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_2068 = &Logger;
            local_206c = 4;
            local_2078 = "Corrupted data: Bad magic";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
            local_1c68 = 0x129358;
            local_1c58 = &Logger;
            local_1c70 = local_2078;
            local_1c40 = &Logger;
            local_1c60 = local_2200;
            local_1c50 = local_1c68;
            local_1c48 = local_2200;
            local_1c38 = local_1c68;
            local_1c30 = local_2200;
            std::operator<<(aoStack_21f0,(string *)&Logger.Prefix);
            local_1c18 = &Logger;
            local_1c20 = local_1c60;
            local_1c28 = local_1c70;
            local_1bb8 = local_1c60;
            local_1bc0 = local_1c70;
            std::operator<<((ostream *)(local_1c60 + 0x10),local_1c70);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x104fc6);
          }
        }
        local_2418 = tonk::ReadU32_LE(local_23e8 + 9);
        if (in_RDI->NextPacketIndex != local_2418) {
          local_2398 = &Logger;
          local_23a0 = "Corrupted data: Incorrect packet id";
          local_1b78 = &Logger;
          local_1b7c = 4;
          local_1b88 = "Corrupted data: Incorrect packet id";
          local_1b68 = &Logger;
          local_1b6c = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_17e0 = &Logger;
            local_17e4 = 4;
            local_17f0 = "Corrupted data: Incorrect packet id";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
            local_15d8 = 0x129358;
            local_15c8 = &Logger;
            local_15e0 = local_17f0;
            local_15b0 = &Logger;
            local_15d0 = local_1978;
            local_15c0 = local_15d8;
            local_15b8 = local_1978;
            local_15a8 = local_15d8;
            local_15a0 = local_1978;
            std::operator<<(aoStack_1968,(string *)&Logger.Prefix);
            local_1528 = &Logger;
            local_1530 = local_15d0;
            local_1538 = local_15e0;
            local_14f0 = local_15d0;
            local_14f8 = local_15e0;
            std::operator<<((ostream *)(local_15d0 + 0x10),local_15e0);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10527d);
          }
        }
        in_RDI->NextPacketIndex = local_2418 + 1;
        for (local_241c = 0xd; local_241c < local_23ec; local_241c = local_241c + 1) {
        }
        tonk::SDKConnection::GetStatus((SDKConnection *)in_stack_ffffffffffffd2a0);
        if ((local_2434 & 1) != 0) {
          local_2440 = tonk_time();
          local_2448 = local_2440 - local_2410;
          test::OWDTimeStatistics::AddSample
                    (in_stack_ffffffffffffd2b0,(uint64_t)in_stack_ffffffffffffd2a8);
          if (1999999 < local_2440 - in_RDI->LastStatsUsec) {
            in_RDI->LastStatsUsec = local_2440;
            local_244c = (int)local_2440 - (int)local_2408;
            local_2450 = (int)local_2440 - (int)local_2410;
            local_2340 = &Logger;
            local_2348 = "DATA RESULT: Transmission time (acc=16) = ";
            local_2350 = &local_244c;
            local_2358 = ", (acc=23) = ";
            local_2360 = &local_2450;
            local_2368 = " # ";
            local_2370 = &local_2418;
            local_1258 = &Logger;
            local_125c = 2;
            local_1268 = "DATA RESULT: Transmission time (acc=16) = ";
            local_1278 = ", (acc=23) = ";
            local_1288 = " # ";
            local_1248 = &Logger;
            local_124c = 2;
            local_1290 = local_2370;
            local_1280 = local_2360;
            local_1270 = local_2350;
            if ((int)Logger.ChannelMinLevel < 3) {
              local_1070 = &Logger;
              local_1074 = 2;
              local_1080 = "DATA RESULT: Transmission time (acc=16) = ";
              local_1090 = ", (acc=23) = ";
              local_10a0 = " # ";
              local_10a8 = local_2370;
              local_1098 = local_2360;
              local_1088 = local_2350;
              logger::LogStringBuffer::LogStringBuffer
                        (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
              local_1038 = 0x129358;
              local_1028 = &Logger;
              local_1040 = local_1080;
              local_1048 = local_1088;
              local_1050 = local_1090;
              local_1058 = local_1098;
              local_1060 = local_10a0;
              local_1068 = local_10a8;
              local_1010 = &Logger;
              local_1030 = local_1230;
              local_1020 = local_1038;
              local_1018 = local_1230;
              local_1008 = local_1038;
              local_1000 = local_1230;
              std::operator<<(aoStack_1220,(string *)&Logger.Prefix);
              local_fc0 = &Logger;
              local_fc8 = local_1030;
              local_fd0 = local_1040;
              local_fd8 = local_1048;
              local_fe0 = local_1050;
              local_fe8 = local_1058;
              local_ff0 = local_1060;
              local_ff8 = local_1068;
              local_fa8 = &Logger;
              local_fb0 = local_1030;
              local_fb8 = local_1040;
              local_f60 = local_1030;
              local_f68 = local_1040;
              std::operator<<((ostream *)(local_1030 + 0x10),local_1040);
              local_f70 = &Logger;
              local_f78 = local_fc8;
              local_f80 = local_fd8;
              local_f88 = local_fe0;
              local_f90 = local_fe8;
              local_f98 = local_ff0;
              local_fa0 = local_ff8;
              local_f48 = &Logger;
              local_f50 = local_fc8;
              local_f58 = local_fd8;
              local_f08 = local_fc8;
              local_f10 = local_fd8;
              std::ostream::operator<<((ostream *)(local_fc8 + 0x10),*local_fd8);
              local_f18 = &Logger;
              local_f20 = local_f78;
              local_f28 = local_f88;
              local_f30 = local_f90;
              local_f38 = local_f98;
              local_f40 = local_fa0;
              local_ef0 = &Logger;
              local_ef8 = local_f78;
              local_f00 = local_f88;
              local_e90 = local_f78;
              local_e98 = local_f88;
              std::operator<<((ostream *)(local_f78 + 0x10),local_f88);
              local_ec8 = &Logger;
              local_ed0 = local_f20;
              local_ed8 = local_f30;
              local_ee0 = local_f38;
              local_ee8 = local_f40;
              local_eb0 = &Logger;
              local_eb8 = local_f20;
              local_ec0 = local_f30;
              local_ea0 = local_f20;
              local_ea8 = local_f30;
              std::ostream::operator<<((ostream *)(local_f20 + 0x10),*local_f30);
              local_e70 = &Logger;
              local_e78 = local_ed0;
              local_e80 = local_ee0;
              local_e88 = local_ee8;
              local_e30 = &Logger;
              local_e38 = local_ed0;
              local_e40 = local_ee0;
              local_e20 = local_ed0;
              local_e28 = local_ee0;
              std::operator<<((ostream *)(local_ed0 + 0x10),local_ee0);
              local_e58 = &Logger;
              local_e60 = local_e78;
              local_e68 = local_e88;
              local_e48 = local_e78;
              local_e50 = local_e88;
              std::ostream::operator<<((ostream *)(local_e78 + 0x10),*local_e88);
              logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
              logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x105b85);
            }
            test::OWDTimeStatistics::PrintStatistics(in_stack_ffffffffffffd560);
          }
        }
      }
      else if (*in_RDX == 2) {
        in_RDI->P2PRequested = true;
        tonk::SDKConnection::GetStatus((SDKConnection *)in_stack_ffffffffffffd2a0);
        tonk::SDKConnectionList<MyServerConnection>::GetList(in_stack_ffffffffffffd2e8);
        local_2488 = local_2480;
        local_2490._M_current =
             (shared_ptr<MyServerConnection> *)
             std::
             vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
             ::begin(in_stack_ffffffffffffd298);
        local_2498 = (shared_ptr<MyServerConnection> *)
                     std::
                     vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                     ::end(in_stack_ffffffffffffd298);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                                   *)in_stack_ffffffffffffd2a0,
                                  (__normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                                   *)in_stack_ffffffffffffd298), bVar1) {
          local_24a0 = &__gnu_cxx::
                        __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                        ::operator*(&local_2490)->
                        super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>;
          peVar2 = std::__shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>::get
                             (local_24a0);
          if ((peVar2 != in_RDI) &&
             (peVar3 = std::
                       __shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x105c82), (peVar3->P2PRequested & 1U) != 0)) {
            std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x105c99);
            tonk::SDKConnection::GetStatus((SDKConnection *)in_stack_ffffffffffffd2a0);
            local_2320 = local_24b4;
            local_2330 = local_2464;
            local_2310 = &Logger;
            local_2318 = "Connecting Alice(";
            local_2328 = ") and Bob(";
            local_2338 = ")";
            local_de8 = &Logger;
            local_dec = 2;
            local_df8 = "Connecting Alice(";
            local_e08 = ") and Bob(";
            local_e18 = ")";
            local_dd8 = &Logger;
            local_ddc = 2;
            local_e10 = local_2330;
            local_e00 = local_2320;
            if ((int)Logger.ChannelMinLevel < 3) {
              local_c08 = &Logger;
              local_c0c = 2;
              local_c18 = "Connecting Alice(";
              local_c28 = ") and Bob(";
              local_c38 = ")";
              local_c30 = local_2330;
              local_c20 = local_2320;
              logger::LogStringBuffer::LogStringBuffer
                        (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
              local_bd8 = 0x129358;
              local_bc8 = &Logger;
              local_bd0 = local_dc0;
              local_be0 = local_c18;
              local_be8 = local_c20;
              local_bf0 = local_c28;
              local_bf8 = local_c30;
              local_c00 = local_c38;
              local_bb0 = &Logger;
              local_bc0 = local_bd8;
              local_bb8 = local_bd0;
              local_ba8 = local_bd8;
              local_ba0 = local_bd0;
              std::operator<<(aoStack_db0,(string *)&Logger.Prefix);
              local_b68 = &Logger;
              local_b70 = local_bd0;
              local_b78 = local_be0;
              local_b80 = local_be8;
              local_b88 = local_bf0;
              local_b90 = local_bf8;
              local_b98 = local_c00;
              local_b50 = &Logger;
              local_b58 = local_bd0;
              local_b60 = local_be0;
              local_ae8 = local_bd0;
              local_af0 = local_be0;
              std::operator<<((ostream *)(local_bd0 + 0x10),local_be0);
              local_b20 = &Logger;
              local_b28 = local_b70;
              local_b30 = local_b80;
              local_b38 = local_b88;
              local_b40 = local_b90;
              local_b48 = local_b98;
              local_b08 = &Logger;
              local_b10 = local_b70;
              local_b18 = local_b80;
              local_af8 = local_b70;
              local_b00 = local_b80;
              std::ostream::operator<<((ostream *)(local_b70 + 0x10),*local_b80);
              local_ac0 = &Logger;
              local_ac8 = local_b28;
              local_ad0 = local_b38;
              local_ad8 = local_b40;
              local_ae0 = local_b48;
              local_aa8 = &Logger;
              local_ab0 = local_b28;
              local_ab8 = local_b38;
              local_a50 = local_b28;
              local_a58 = local_b38;
              std::operator<<((ostream *)(local_b28 + 0x10),local_b38);
              local_a88 = &Logger;
              local_a90 = local_ac8;
              local_a98 = local_ad8;
              local_aa0 = local_ae0;
              local_a70 = &Logger;
              local_a78 = local_ac8;
              local_a80 = local_ad8;
              local_a60 = local_ac8;
              local_a68 = local_ad8;
              std::ostream::operator<<((ostream *)(local_ac8 + 0x10),*local_ad8);
              local_a38 = &Logger;
              local_a40 = local_a90;
              local_a48 = local_aa0;
              local_a28 = local_a90;
              local_a30 = local_aa0;
              std::operator<<((ostream *)(local_a90 + 0x10),local_aa0);
              logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
              logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10636b);
            }
            std::__shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>::get(local_24a0);
            local_24c8 = (TonkResult)
                         tonk::SDKConnection::P2PConnect
                                   (in_stack_ffffffffffffd2a8,
                                    (SDKConnection *)in_stack_ffffffffffffd2a0);
            bVar1 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x1063b2);
            if (!bVar1) break;
            tonk::SDKResult::ToString_abi_cxx11_(in_stack_ffffffffffffd2c8);
            local_22f8 = &Logger;
            local_2300 = "P2PConnect failed: ";
            local_2308 = local_24e8;
            local_a08 = &Logger;
            local_a0c = 4;
            local_a18 = "P2PConnect failed: ";
            local_9f8 = &Logger;
            local_9fc = 4;
            local_a20 = local_2308;
            if ((int)Logger.ChannelMinLevel < 5) {
              local_840 = &Logger;
              local_844 = 4;
              local_850 = "P2PConnect failed: ";
              local_858 = local_2308;
              logger::LogStringBuffer::LogStringBuffer
                        (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
              local_828 = 0x129358;
              local_818 = &Logger;
              local_820 = local_9e0;
              local_830 = local_850;
              local_838 = local_858;
              local_800 = &Logger;
              local_810 = local_828;
              local_808 = local_820;
              local_7f8 = local_828;
              local_7f0 = local_820;
              std::operator<<(aoStack_9d0,(string *)&Logger.Prefix);
              local_7d0 = &Logger;
              local_7d8 = local_820;
              local_7e0 = local_830;
              local_7e8 = local_838;
              local_7b8 = &Logger;
              local_7c0 = local_820;
              local_7c8 = local_830;
              local_780 = local_820;
              local_788 = local_830;
              std::operator<<((ostream *)(local_820 + 0x10),local_830);
              local_7a0 = &Logger;
              local_7a8 = local_7d8;
              local_7b0 = local_7e8;
              local_790 = local_7d8;
              local_798 = local_7e8;
              std::operator<<((ostream *)(local_7d8 + 0x10),local_7e8);
              logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
              logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10674e);
            }
            std::__cxx11::string::~string(local_24e8);
          }
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
          ::operator++(&local_2490);
        }
        std::
        vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
        ::~vector((vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                   *)in_stack_ffffffffffffd2b0);
      }
      else if (*in_RDX == 5) {
        tonk::SDKConnection::GetStatus((SDKConnection *)in_stack_ffffffffffffd2a0);
        local_2508 = local_23e8 + 1;
        local_22d8 = local_24fc;
        local_22c8 = &Logger;
        local_22d0 = "Rebroadcast request from ";
        local_22e0 = " : \'";
        local_22e8 = &local_2508;
        local_22f0 = "\'";
        local_748 = &Logger;
        local_74c = 2;
        local_758 = "Rebroadcast request from ";
        local_768 = " : \'";
        local_778 = "\'";
        local_738 = &Logger;
        local_73c = 2;
        local_770 = local_22e8;
        local_760 = local_22d8;
        if ((int)Logger.ChannelMinLevel < 3) {
          local_568 = &Logger;
          local_56c = 2;
          local_578 = "Rebroadcast request from ";
          local_588 = " : \'";
          local_598 = "\'";
          local_590 = local_22e8;
          local_580 = local_22d8;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
          local_538 = 0x129358;
          local_528 = &Logger;
          local_540 = local_578;
          local_548 = local_580;
          local_550 = local_588;
          local_558 = local_590;
          local_560 = local_598;
          local_510 = &Logger;
          local_530 = local_720;
          local_520 = local_538;
          local_518 = local_720;
          local_508 = local_538;
          local_500 = local_720;
          std::operator<<(aoStack_710,(string *)&Logger.Prefix);
          local_4c8 = &Logger;
          local_4d0 = local_530;
          local_4d8 = local_540;
          local_4e0 = local_548;
          local_4e8 = local_550;
          local_4f0 = local_558;
          local_4f8 = local_560;
          local_4b0 = &Logger;
          local_4b8 = local_530;
          local_4c0 = local_540;
          local_4a0 = local_530;
          local_4a8 = local_540;
          std::operator<<((ostream *)(local_530 + 0x10),local_540);
          local_470 = &Logger;
          local_478 = local_4d0;
          local_480 = local_4e0;
          local_488 = local_4e8;
          local_490 = local_4f0;
          local_498 = local_4f8;
          local_458 = &Logger;
          local_460 = local_4d0;
          local_468 = local_4e0;
          local_448 = local_4d0;
          local_450 = local_4e0;
          std::ostream::operator<<((ostream *)(local_4d0 + 0x10),*local_4e0);
          local_420 = &Logger;
          local_428 = local_478;
          local_430 = local_488;
          local_438 = local_490;
          local_440 = local_498;
          local_408 = &Logger;
          local_410 = local_478;
          local_418 = local_488;
          local_3b0 = local_478;
          local_3b8 = local_488;
          std::operator<<((ostream *)(local_478 + 0x10),local_488);
          local_3e8 = &Logger;
          local_3f0 = local_428;
          local_3f8 = local_438;
          local_400 = local_440;
          local_398 = &Logger;
          local_3a0 = local_428;
          local_3a8 = local_438;
          local_388 = local_428;
          local_390 = local_438;
          std::operator<<((ostream *)(local_428 + 0x10),(char *)*local_438);
          local_3d0 = &Logger;
          local_3d8 = local_3f0;
          local_3e0 = local_400;
          local_3c0 = local_3f0;
          local_3c8 = local_400;
          std::operator<<((ostream *)(local_3f0 + 0x10),local_400);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x106f04);
        }
        tonk::WriteU24_LE_Min4Bytes(auStack_2a87,local_24fc[0]);
        memcpy(auStack_2a84,local_23e8 + 1,(ulong)(local_23ec - 1));
        tonk::SDKConnectionList<MyServerConnection>::GetList(in_stack_ffffffffffffd2e8);
        local_2aa8 = &stack0xffffffffffffd560;
        local_2ab0._M_current =
             (shared_ptr<MyServerConnection> *)
             std::
             vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
             ::begin(in_stack_ffffffffffffd298);
        local_2ab8 = (shared_ptr<MyServerConnection> *)
                     std::
                     vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                     ::end(in_stack_ffffffffffffd298);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                                   *)in_stack_ffffffffffffd2a0,
                                  (__normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                                   *)in_stack_ffffffffffffd298), bVar1) {
          local_2ac0 = &__gnu_cxx::
                        __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                        ::operator*(&local_2ab0)->
                        super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>;
          peVar2 = std::__shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>::get
                             (local_2ac0);
          if (peVar2 != in_RDI) {
            std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x107007);
            local_2ac4 = (TonkResult)
                         tonk::SDKConnection::Send
                                   (in_stack_ffffffffffffd2a8,in_stack_ffffffffffffd2a0,
                                    (uint64_t)in_stack_ffffffffffffd298,0);
          }
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
          ::operator++(&local_2ab0);
        }
        std::
        vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
        ::~vector((vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                   *)in_stack_ffffffffffffd2b0);
      }
      else if (*in_RDX == 6) {
        local_22b8 = &Logger;
        local_22c0 = "Got pre-connect data test";
        local_2278 = &Logger;
        local_227c = 1;
        local_2288 = "Got pre-connect data test";
        local_2268 = &Logger;
        local_226c = 1;
        local_23dc = in_ESI;
        if ((int)Logger.ChannelMinLevel < 2) {
          local_1d08 = &Logger;
          local_1d0c = 1;
          local_1d18 = "Got pre-connect data test";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
          local_1cf8 = 0x129358;
          local_1ce8 = &Logger;
          local_1d00 = local_1d18;
          local_1cd0 = &Logger;
          local_1cf0 = local_1ea0;
          local_1ce0 = local_1cf8;
          local_1cd8 = local_1ea0;
          local_1cc8 = local_1cf8;
          local_1cc0 = local_1ea0;
          std::operator<<(aoStack_1e90,(string *)&Logger.Prefix);
          local_1be8 = &Logger;
          local_1bf0 = local_1cf0;
          local_1bf8 = local_1d00;
          local_1bd8 = local_1cf0;
          local_1be0 = local_1d00;
          std::operator<<((ostream *)(local_1cf0 + 0x10),local_1d00);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1072ff);
        }
        local_2ac5 = test::ValidatePreconnectData(local_23dc,local_23e8,local_23ec);
        if (!(bool)local_2ac5) {
          local_23a8 = &Logger;
          local_23b0 = "ERROR: Preconnect data was invalid!";
          local_1b50 = &Logger;
          local_1b54 = 4;
          local_1b60 = "ERROR: Preconnect data was invalid!";
          local_1b40 = &Logger;
          local_1b44 = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_1990 = &Logger;
            local_1994 = 4;
            local_19a0 = "ERROR: Preconnect data was invalid!";
            pCVar4 = &Logger;
            puVar5 = local_1b28;
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
            local_1590 = (string *)
                         ((((OutputWorker *)pCVar4)->QueueLock).super___mutex_base._M_mutex.__size +
                         0x10);
            local_1598 = local_19a0;
            this_00 = (OutputWorker *)pCVar4;
            local_1588 = puVar5;
            local_1580 = (OutputWorker *)pCVar4;
            local_1578 = local_1590;
            local_1570 = puVar5;
            local_1568 = (OutputWorker *)pCVar4;
            local_1560 = local_1590;
            local_1558 = puVar5;
            std::operator<<((ostream *)(puVar5 + 0x10),local_1590);
            local_1548 = local_1588;
            local_1550 = local_1598;
            local_14e0 = local_1588;
            local_14e8 = local_1598;
            local_1540 = (OutputWorker *)pCVar4;
            std::operator<<((ostream *)(local_1588 + 0x10),local_1598);
            buffer_12 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(this_00,buffer_12);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x107583);
          }
        }
      }
      else {
        local_2acc = (uint)*in_RDX;
        local_2290 = &Logger;
        local_2298 = "MyServerConnection: Got ";
        local_22a0 = &local_23ec;
        local_22a8 = " bytes of message data unexpected type ";
        local_22b0 = &local_2acc;
        local_358 = &Logger;
        local_35c = 4;
        local_368 = "MyServerConnection: Got ";
        local_378 = " bytes of message data unexpected type ";
        local_348 = &Logger;
        local_34c = 4;
        if ((int)Logger.ChannelMinLevel < 5) {
          local_180 = &Logger;
          local_184 = 4;
          local_190 = "MyServerConnection: Got ";
          local_1a0 = " bytes of message data unexpected type ";
          local_380 = local_22b0;
          local_370 = local_22a0;
          local_1a8 = local_22b0;
          local_198 = local_22a0;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffd2a0,(char *)in_stack_ffffffffffffd298,Trace);
          local_158 = 0x129358;
          local_148 = &Logger;
          local_160 = local_190;
          local_168 = local_198;
          local_170 = local_1a0;
          local_178 = local_1a8;
          pCVar4 = &Logger;
          local_130 = &Logger;
          local_150 = local_330;
          local_140 = local_158;
          local_138 = local_330;
          local_128 = local_158;
          local_120 = local_330;
          std::operator<<(aoStack_320,(string *)&Logger.Prefix);
          local_f8 = local_150;
          local_100 = local_160;
          local_108 = local_168;
          local_110 = local_170;
          local_118 = local_178;
          local_e0 = local_150;
          local_e8 = local_160;
          local_c8 = local_150;
          local_d0 = local_160;
          local_f0 = pCVar4;
          local_d8 = pCVar4;
          std::operator<<((ostream *)(local_150 + 0x10),local_160);
          local_a8 = local_f8;
          local_b0 = local_108;
          local_b8 = local_110;
          local_c0 = local_118;
          local_90 = local_f8;
          local_98 = local_108;
          local_78 = local_f8;
          local_80 = local_108;
          local_a0 = pCVar4;
          local_88 = pCVar4;
          std::ostream::operator<<((ostream *)(local_f8 + 0x10),*local_108);
          local_60 = local_a8;
          local_68 = local_b8;
          local_70 = local_c0;
          local_20 = local_a8;
          local_28 = local_b8;
          local_8 = local_a8;
          local_10 = local_b8;
          local_58 = pCVar4;
          local_18 = pCVar4;
          std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
          local_48 = local_60;
          local_50 = local_70;
          local_30 = local_60;
          local_38 = local_70;
          local_40 = pCVar4;
          std::ostream::operator<<((ostream *)(local_60 + 0x10),*local_70);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x107aed);
        }
      }
    }
  }
  return;
}

Assistant:

void MyServerConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (bytes <= 0) {
        return;
    }

    if (data[0] == 200)
    {
        static uint8_t expected = 0;
        ++expected;
        if (data[1] != expected)
        {
            //Logger.Info("UNORDERED: ", (int)data[1]);
            expected = data[1];
        }
        return;
    }

    if (data[0] == ID_LowPriBulkData_NoTimestamp)
    {
        TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
        TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
        uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
        if (magic != kLowPriBulkMagic) {
            Logger.Error("Corrupted data: Bad magic");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
        uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
        TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
        if (NextPacketIndex != packetIndex) {
            Logger.Error("Corrupted data: Incorrect packet id");
        }
        NextPacketIndex = packetIndex + 1;
        for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
            TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
        }

        return;
    }

    if (data[0] == ID_LowPriBulkData_HasTimestamp)
    {
        TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
        if (channel != kLowPriBulkData_Channel) {
            Logger.Error("Corrupted data: Wrong channel");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
        uint16_t ts16 = tonk::ReadU16_LE(data + 1);
        uint32_t ts23 = tonk::ReadU24_LE(data + 1 + 2);
        uint64_t lo16 = FromLocalTime16(ts16);
        uint64_t lo23 = FromLocalTime23(ts23);
        uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
        if (magic != kLowPriBulkMagic) {
            Logger.Error("Corrupted data: Bad magic");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
        uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
        TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
        if (NextPacketIndex != packetIndex) {
            Logger.Error("Corrupted data: Incorrect packet id");
        }
        NextPacketIndex = packetIndex + 1;
        for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i)
        {
            TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
        }

        if (0 != (GetStatus().Flags & TonkFlag_TimeSync))
        {
            uint64_t nowUsec = tonk_time();
            uint64_t owdUsec = nowUsec - lo23;
            OWDStats.AddSample(owdUsec);

            if (nowUsec - LastStatsUsec >= kStatsReportIntervalUsec)
            {
                LastStatsUsec = nowUsec;
                Logger.Info("DATA RESULT: Transmission time (acc=16) = ", (int)(nowUsec - lo16), ", (acc=23) = ", (int)(nowUsec - lo23), " # ", packetIndex);
                OWDStats.PrintStatistics();
            }
        }

        return;
    }
    if (data[0] == ID_P2PConnectionStart)
    {
        P2PRequested = true;

        TonkStatus statusBob = GetStatus();

        auto connections = Server->ConnectionList.GetList();
        for (auto& connection : connections)
        {
            // If there is a second connection that also requested P2P:
            if (connection.get() != this && connection->P2PRequested)
            {
                TonkStatus statusAlice = connection->GetStatus();

                Logger.Info("Connecting Alice(", statusAlice.LocallyAssignedIdForRemoteHost,
                    ") and Bob(", statusBob.LocallyAssignedIdForRemoteHost, ")");

                tonk::SDKResult result = this->P2PConnect(connection.get());
                if (result)
                {
                    Logger.Error("P2PConnect failed: ", result.ToString());
                    continue;
                }

                break;
            }
        }
        return;
    }
    if (data[0] == ID_ConnectionRebroadcast)
    {
        TonkStatus status = GetStatus();

        const char* str = (char*)data + 1;
        Logger.Info("Rebroadcast request from ", status.LocallyAssignedIdForRemoteHost, " : '", str, "'");

        uint8_t msg[1400];
        msg[0] = ID_ConnectionRebroadcast;
        tonk::WriteU24_LE_Min4Bytes(msg + 1, status.LocallyAssignedIdForRemoteHost);
        memcpy(msg + 1 + 3, data + 1, bytes - 1);

        auto connections = Server->ConnectionList.GetList();
        for (auto& connection : connections)
        {
            // If there is a second connection that also requested P2P:
            if (connection.get() != this) {
                connection->Send(msg, 1 + 3 + bytes, TonkChannel_Reliable0 + 1);
            }
        }
        return;
    }
    if (data[0] == ID_PreConnectDataTest)
    {
        Logger.Debug("Got pre-connect data test");

        const bool validated = ValidatePreconnectData(channel, data, bytes);

        if (!validated)
        {
            Logger.Error("ERROR: Preconnect data was invalid!");
            TONK_CPP_SDK_DEBUG_BREAK();
        }
        return;
    }

    Logger.Error("MyServerConnection: Got ", bytes, " bytes of message data unexpected type ", (int)data[0]);
    TONK_CPP_SDK_DEBUG_BREAK();
}